

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void encode_ext(upb_encstate *e,upb_MiniTableExtension *ext,upb_MessageValue ext_val,
               _Bool is_message_set)

{
  undefined3 in_register_00000081;
  anon_union_8_2_9eb4e620_for_upb_Message_0 local_18;
  size_t local_10;
  upb_MiniTableSub local_8;
  
  local_10 = ext_val.str_val.size;
  local_18.internal_opaque = (uintptr_t)ext_val.double_val;
  if (CONCAT31(in_register_00000081,is_message_set) == 0) {
    local_8.submsg_dont_copy_me__upb_internal_use_only =
         (upb_MiniTable *)&ext->sub_dont_copy_me__upb_internal_use_only;
    if (((ext->field_dont_copy_me__upb_internal_use_only).
         descriptortype_dont_copy_me__upb_internal_use_only & 0xfe) != 10) {
      local_8 = *(upb_MiniTableSub *)local_8.submsg_dont_copy_me__upb_internal_use_only;
    }
    encode_field(e,(upb_Message *)&local_18,(upb_MiniTableSubInternal *)&local_8,
                 &ext->field_dont_copy_me__upb_internal_use_only);
    return;
  }
  encode_msgset_item(e,ext,ext_val);
  return;
}

Assistant:

static void encode_ext(upb_encstate* e, const upb_MiniTableExtension* ext,
                       upb_MessageValue ext_val, bool is_message_set) {
  if (UPB_UNLIKELY(is_message_set)) {
    encode_msgset_item(e, ext, ext_val);
  } else {
    upb_MiniTableSubInternal sub;
    if (upb_MiniTableField_IsSubMessage(&ext->UPB_PRIVATE(field))) {
      sub.UPB_PRIVATE(submsg) = &ext->UPB_PRIVATE(sub).UPB_PRIVATE(submsg);
    } else {
      sub.UPB_PRIVATE(subenum) = ext->UPB_PRIVATE(sub).UPB_PRIVATE(subenum);
    }
    encode_field(e, &ext_val.UPB_PRIVATE(ext_msg_val), &sub,
                 &ext->UPB_PRIVATE(field));
  }
}